

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidjson.h
# Opt level: O1

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseValue<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  byte *pbVar1;
  char cVar2;
  char *pcVar3;
  Ch *pCVar4;
  Ch *pCVar5;
  double *pdVar6;
  double dVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  byte bVar11;
  byte *pbVar12;
  long lVar13;
  byte *pbVar14;
  SizeType SVar15;
  int iVar16;
  ulong uVar17;
  byte bVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  ulong i;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  
  bVar11 = *is->src_;
  if (bVar11 < 0x6e) {
    if (bVar11 == 0x22) {
      ParseString<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                (this,is,handler,false);
      return;
    }
    if (bVar11 != 0x5b) {
      if (bVar11 != 0x66) {
        ParseNumber<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  (this,is,handler);
        return;
      }
      pcVar3 = is->src_;
      if (*pcVar3 != 'f') {
        __assert_fail("is.Peek() == \'f\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                      ,0x243,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseFalse(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      is->src_ = pcVar3 + 2;
      if ((((pcVar3[1] == 'a') && (is->src_ = pcVar3 + 3, pcVar3[2] == 'l')) &&
          (is->src_ = pcVar3 + 4, pcVar3[3] == 's')) && (is->src_ = pcVar3 + 5, pcVar3[4] == 'e')) {
        if ((handler->stack_).stackEnd_ <= (handler->stack_).stackTop_ + 0x18) {
          internal::Stack<rapidjson::CrtAllocator>::
          Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                    (&handler->stack_,1);
        }
        pcVar3 = (handler->stack_).stackTop_;
        (handler->stack_).stackTop_ = pcVar3 + 0x18;
        pcVar3[0] = '\0';
        pcVar3[1] = '\0';
        pcVar3[2] = '\0';
        pcVar3[3] = '\0';
        pcVar3[4] = '\0';
        pcVar3[5] = '\0';
        pcVar3[6] = '\0';
        pcVar3[7] = '\0';
        pcVar3[8] = '\0';
        pcVar3[9] = '\0';
        pcVar3[10] = '\0';
        pcVar3[0xb] = '\0';
        pcVar3[0xc] = '\0';
        pcVar3[0xd] = '\0';
        pcVar3[0xe] = '\0';
        pcVar3[0xf] = '\0';
        pcVar3[0x10] = '\x01';
        pcVar3[0x11] = '\x01';
        pcVar3[0x12] = '\0';
        pcVar3[0x13] = '\0';
      }
      else {
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                        ,0x24b,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseFalse(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
        pCVar4 = is->head_;
        pCVar5 = is->src_;
        *(undefined4 *)(this + 0x30) = 3;
        *(Ch **)(this + 0x38) = pCVar5 + ~(ulong)pCVar4;
      }
      return;
    }
    if (*is->src_ != '[') {
      __assert_fail("is.Peek() == \'[\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                    ,0x206,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    is->src_ = is->src_ + 1;
    if ((handler->stack_).stackEnd_ <= (handler->stack_).stackTop_ + 0x18) {
      internal::Stack<rapidjson::CrtAllocator>::
      Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                (&handler->stack_,1);
    }
    pcVar3 = (handler->stack_).stackTop_;
    (handler->stack_).stackTop_ = pcVar3 + 0x18;
    pcVar3[0] = '\0';
    pcVar3[1] = '\0';
    pcVar3[2] = '\0';
    pcVar3[3] = '\0';
    pcVar3[4] = '\0';
    pcVar3[5] = '\0';
    pcVar3[6] = '\0';
    pcVar3[7] = '\0';
    pcVar3[8] = '\0';
    pcVar3[9] = '\0';
    pcVar3[10] = '\0';
    pcVar3[0xb] = '\0';
    pcVar3[0xc] = '\0';
    pcVar3[0xd] = '\0';
    pcVar3[0xe] = '\0';
    pcVar3[0xf] = '\0';
    pcVar3[0x10] = '\x04';
    pcVar3[0x11] = '\0';
    pcVar3[0x12] = '\0';
    pcVar3[0x13] = '\0';
    pbVar12 = (byte *)is->src_;
    while (((ulong)*pbVar12 < 0x21 && ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) != 0))) {
      pbVar12 = pbVar12 + 1;
    }
    is->src_ = (Ch *)pbVar12;
    if (*pbVar12 == 0x5d) {
      is->src_ = (Ch *)(pbVar12 + 1);
      bVar10 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
               ::EndArray(handler,0);
      if (!bVar10) {
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                        ,0x211,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
LAB_0011b703:
        lVar13 = (long)is->src_ - (long)is->head_;
        *(undefined4 *)(this + 0x30) = 0x10;
LAB_0011b711:
        *(long *)(this + 0x38) = lVar13;
      }
    }
    else {
      ParseValue<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                (this,is,handler);
      if (*(int *)(this + 0x30) == 0) {
        SVar15 = 0;
        do {
          pbVar14 = (byte *)(is->src_ + 1);
          pbVar12 = pbVar14;
          while (((ulong)pbVar12[-1] < 0x21 &&
                 ((0x100002600U >> ((ulong)pbVar12[-1] & 0x3f) & 1) != 0))) {
            pbVar12 = pbVar12 + 1;
            pbVar14 = pbVar14 + 1;
          }
          SVar15 = SVar15 + 1;
          is->src_ = (Ch *)pbVar12;
          if (pbVar12[-1] != 0x2c) {
            if (pbVar12[-1] != 0x5d) {
              lVar13 = (long)pbVar14 - (long)is->head_;
              *(undefined4 *)(this + 0x30) = 7;
              goto LAB_0011b711;
            }
            bVar10 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                     ::EndArray(handler,SVar15);
            if (bVar10) {
              return;
            }
            if (*(int *)(this + 0x30) != 0) {
              __assert_fail("!HasParseError()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                            ,0x220,
                            "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                           );
            }
            goto LAB_0011b703;
          }
          while (((ulong)*pbVar12 < 0x21 && ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) != 0)))
          {
            pbVar12 = pbVar12 + 1;
          }
          is->src_ = (Ch *)pbVar12;
          ParseValue<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    (this,is,handler);
        } while (*(int *)(this + 0x30) == 0);
      }
    }
    return;
  }
  if (bVar11 == 0x7b) {
    if (*is->src_ != '{') {
      __assert_fail("is.Peek() == \'{\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                    ,0x1d4,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    is->src_ = is->src_ + 1;
    if ((handler->stack_).stackEnd_ <= (handler->stack_).stackTop_ + 0x18) {
      internal::Stack<rapidjson::CrtAllocator>::
      Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                (&handler->stack_,1);
    }
    pcVar3 = (handler->stack_).stackTop_;
    (handler->stack_).stackTop_ = pcVar3 + 0x18;
    pcVar3[0] = '\0';
    pcVar3[1] = '\0';
    pcVar3[2] = '\0';
    pcVar3[3] = '\0';
    pcVar3[4] = '\0';
    pcVar3[5] = '\0';
    pcVar3[6] = '\0';
    pcVar3[7] = '\0';
    pcVar3[8] = '\0';
    pcVar3[9] = '\0';
    pcVar3[10] = '\0';
    pcVar3[0xb] = '\0';
    pcVar3[0xc] = '\0';
    pcVar3[0xd] = '\0';
    pcVar3[0xe] = '\0';
    pcVar3[0xf] = '\0';
    pcVar3[0x10] = '\x03';
    pcVar3[0x11] = '\0';
    pcVar3[0x12] = '\0';
    pcVar3[0x13] = '\0';
    pbVar12 = (byte *)is->src_;
    while (((ulong)*pbVar12 < 0x21 && ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) != 0))) {
      pbVar12 = pbVar12 + 1;
    }
    is->src_ = (Ch *)pbVar12;
    if (*pbVar12 == 0x7d) {
      is->src_ = (Ch *)(pbVar12 + 1);
      bVar10 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
               ::EndObject(handler,0);
      if (bVar10) {
        return;
      }
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                      ,0x1df,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
LAB_0011b4a5:
      lVar13 = (long)is->src_ - (long)is->head_;
      *(undefined4 *)(this + 0x30) = 0x10;
    }
    else {
      pbVar12 = (byte *)is->src_;
      if (*pbVar12 == 0x22) {
        SVar15 = 0;
        do {
          ParseString<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    (this,is,handler,true);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          pbVar14 = (byte *)(is->src_ + 1);
          pbVar12 = pbVar14;
          while (((ulong)pbVar12[-1] < 0x21 &&
                 ((0x100002600U >> ((ulong)pbVar12[-1] & 0x3f) & 1) != 0))) {
            pbVar12 = pbVar12 + 1;
            pbVar14 = pbVar14 + 1;
          }
          is->src_ = (Ch *)pbVar12;
          if (pbVar12[-1] != 0x3a) {
            lVar13 = (long)pbVar14 - (long)is->head_;
            *(undefined4 *)(this + 0x30) = 5;
            goto LAB_0011b5a0;
          }
          while (((ulong)*pbVar12 < 0x21 && ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) != 0)))
          {
            pbVar12 = pbVar12 + 1;
          }
          is->src_ = (Ch *)pbVar12;
          ParseValue<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    (this,is,handler);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          pbVar12 = (byte *)(is->src_ + 1);
          pbVar14 = pbVar12;
          while (((ulong)pbVar12[-1] < 0x21 &&
                 ((0x100002600U >> ((ulong)pbVar12[-1] & 0x3f) & 1) != 0))) {
            pbVar12 = pbVar12 + 1;
            pbVar14 = pbVar14 + 1;
          }
          SVar15 = SVar15 + 1;
          is->src_ = (Ch *)pbVar12;
          if (pbVar12[-1] != 0x2c) {
            if (pbVar12[-1] != 0x7d) {
              lVar13 = (long)pbVar14 - (long)is->head_;
              *(undefined4 *)(this + 0x30) = 6;
              goto LAB_0011b5a0;
            }
            bVar10 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                     ::EndObject(handler,SVar15);
            if (bVar10) {
              return;
            }
            if (*(int *)(this + 0x30) != 0) {
              __assert_fail("!HasParseError()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                            ,0x1fc,
                            "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                           );
            }
            goto LAB_0011b4a5;
          }
          while (((ulong)*pbVar12 < 0x21 && ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) != 0)))
          {
            pbVar12 = pbVar12 + 1;
          }
          is->src_ = (Ch *)pbVar12;
        } while (*pbVar12 == 0x22);
      }
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                      ,0x1e5,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      lVar13 = (long)pbVar12 - (long)is->head_;
      *(undefined4 *)(this + 0x30) = 4;
    }
LAB_0011b5a0:
    *(long *)(this + 0x38) = lVar13;
    return;
  }
  if (bVar11 == 0x74) {
    pcVar3 = is->src_;
    if (*pcVar3 != 't') {
      __assert_fail("is.Peek() == \'t\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                    ,0x236,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseTrue(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    is->src_ = pcVar3 + 2;
    if (((pcVar3[1] == 'r') && (is->src_ = pcVar3 + 3, pcVar3[2] == 'u')) &&
       (is->src_ = pcVar3 + 4, pcVar3[3] == 'e')) {
      if ((handler->stack_).stackEnd_ <= (handler->stack_).stackTop_ + 0x18) {
        internal::Stack<rapidjson::CrtAllocator>::
        Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                  (&handler->stack_,1);
      }
      pcVar3 = (handler->stack_).stackTop_;
      (handler->stack_).stackTop_ = pcVar3 + 0x18;
      pcVar3[0] = '\0';
      pcVar3[1] = '\0';
      pcVar3[2] = '\0';
      pcVar3[3] = '\0';
      pcVar3[4] = '\0';
      pcVar3[5] = '\0';
      pcVar3[6] = '\0';
      pcVar3[7] = '\0';
      pcVar3[8] = '\0';
      pcVar3[9] = '\0';
      pcVar3[10] = '\0';
      pcVar3[0xb] = '\0';
      pcVar3[0xc] = '\0';
      pcVar3[0xd] = '\0';
      pcVar3[0xe] = '\0';
      pcVar3[0xf] = '\0';
      pcVar3[0x10] = '\x02';
      pcVar3[0x11] = '\x01';
      pcVar3[0x12] = '\0';
      pcVar3[0x13] = '\0';
    }
    else {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                      ,0x23e,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseTrue(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      pCVar4 = is->head_;
      pCVar5 = is->src_;
      *(undefined4 *)(this + 0x30) = 3;
      *(Ch **)(this + 0x38) = pCVar5 + ~(ulong)pCVar4;
    }
    return;
  }
  if (bVar11 == 0x6e) {
    ParseNull<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
              (this,is,handler);
    return;
  }
  pcVar3 = is->src_;
  pCVar4 = is->head_;
  cVar2 = *pcVar3;
  pbVar12 = (byte *)(pcVar3 + (cVar2 == '-'));
  bVar11 = pcVar3[cVar2 == '-'];
  if (bVar11 == 0x30) {
    pbVar14 = pbVar12 + 1;
    i = 0;
    bVar10 = false;
    iVar16 = 0;
    uVar21 = 0;
    goto LAB_0011b864;
  }
  if ((byte)(bVar11 - 0x31) < 9) {
    uVar21 = bVar11 - 0x30;
    bVar11 = pbVar12[1];
    pbVar14 = pbVar12 + 1;
    i = 0;
    if (cVar2 == '-') {
      if (9 < (byte)(bVar11 - 0x30)) {
LAB_0011bb9a:
        bVar10 = false;
        iVar16 = 0;
        goto LAB_0011b864;
      }
      iVar16 = 0;
      do {
        if ((0xccccccb < uVar21) && ((uVar21 != 0xccccccc || ('8' < (char)bVar11))))
        goto LAB_0011bd91;
        uVar21 = ((uint)bVar11 + uVar21 * 10) - 0x30;
        iVar16 = iVar16 + 1;
        bVar11 = pbVar14[1];
        pbVar14 = pbVar14 + 1;
      } while ((byte)(bVar11 - 0x30) < 10);
    }
    else {
      if (9 < (byte)(bVar11 - 0x30)) goto LAB_0011bb9a;
      iVar16 = 0;
      do {
        if ((0x19999998 < uVar21) && ((uVar21 != 0x19999999 || ('5' < (char)bVar11))))
        goto LAB_0011bd91;
        uVar21 = ((uint)bVar11 + uVar21 * 10) - 0x30;
        iVar16 = iVar16 + 1;
        bVar11 = pbVar14[1];
        pbVar14 = pbVar14 + 1;
      } while ((byte)(bVar11 - 0x30) < 10);
    }
    i = 0;
    bVar10 = false;
    goto LAB_0011b864;
  }
  if (*(int *)(this + 0x30) != 0) {
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                  ,0x335,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  lVar13 = (long)pbVar12 - (long)pCVar4;
  *(undefined4 *)(this + 0x30) = 3;
  goto LAB_0011be69;
LAB_0011bd91:
  bVar10 = true;
  i = (ulong)uVar21;
LAB_0011b864:
  dVar7 = 0.0;
  if (bVar10) {
    bVar11 = *pbVar14;
    bVar18 = bVar11 - 0x30;
    if (cVar2 == '-') {
      while (bVar18 < 10) {
        if ((0xccccccccccccccb < i) && ((i != 0xccccccccccccccc || ('8' < (char)bVar11))))
        goto LAB_0011bce2;
        i = (ulong)(bVar11 & 0xf) + i * 10;
        iVar16 = iVar16 + 1;
        bVar11 = pbVar14[1];
        pbVar14 = pbVar14 + 1;
        bVar18 = bVar11 - 0x30;
      }
    }
    else {
      while (bVar18 < 10) {
        if ((0x1999999999999998 < i) && ((i != 0x1999999999999999 || ('5' < (char)bVar11))))
        goto LAB_0011bce2;
        i = (ulong)(bVar11 & 0xf) + i * 10;
        iVar16 = iVar16 + 1;
        bVar11 = pbVar14[1];
        pbVar14 = pbVar14 + 1;
        bVar18 = bVar11 - 0x30;
      }
    }
  }
  bVar8 = false;
  goto LAB_0011b9b6;
LAB_0011bce2:
  auVar24._8_4_ = (int)(i >> 0x20);
  auVar24._0_8_ = i;
  auVar24._12_4_ = 0x45300000;
  dVar7 = (auVar24._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0);
  bVar8 = true;
LAB_0011b9b6:
  if ((bVar8) && ((byte)(*pbVar14 - 0x30) < 10)) {
    lVar13 = (long)pbVar14 - (long)pCVar4;
    pbVar12 = pbVar14;
    do {
      if (1.7976931348623158e+307 <= dVar7) {
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                        ,0x357,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
        *(undefined4 *)(this + 0x30) = 0xd;
        *(long *)(this + 0x38) = lVar13;
        goto LAB_0011beec;
      }
      pbVar14 = pbVar12 + 1;
      dVar7 = dVar7 * 10.0 + (double)((char)*pbVar12 + -0x30);
      pbVar1 = pbVar12 + 1;
      lVar13 = lVar13 + 1;
      pbVar12 = pbVar14;
    } while ((byte)(*pbVar1 - 0x30) < 10);
  }
  iVar20 = 0;
  if (*pbVar14 == 0x2e) {
    pbVar12 = pbVar14 + 1;
    if (9 < (byte)(pbVar14[1] - 0x30)) {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                      ,0x364,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      *(undefined4 *)(this + 0x30) = 0xe;
      *(long *)(this + 0x38) = (long)pbVar12 - (long)pCVar4;
      goto LAB_0011beec;
    }
    iVar19 = 0;
    if (!bVar8) {
      uVar17 = (ulong)uVar21;
      if (bVar10) {
        uVar17 = i;
      }
      i = uVar17;
      bVar11 = *pbVar12;
      iVar19 = 0;
      if ('/' < (char)bVar11) {
        iVar19 = 0;
        pbVar14 = pbVar12;
        do {
          pbVar12 = pbVar14;
          if ((0x39 < bVar11) || (i >> 0x35 != 0)) break;
          pbVar12 = pbVar14 + 1;
          iVar19 = iVar19 + -1;
          i = (ulong)(bVar11 - 0x30) + i * 10;
          iVar16 = iVar16 + (uint)(i != 0);
          bVar11 = pbVar14[1];
          pbVar14 = pbVar12;
        } while ('/' < (char)bVar11);
      }
      auVar25._8_4_ = (int)(i >> 0x20);
      auVar25._0_8_ = i;
      auVar25._12_4_ = 0x45300000;
      dVar7 = (auVar25._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0);
      bVar8 = true;
    }
    bVar11 = *pbVar12;
    pbVar14 = pbVar12;
    while ((byte)(bVar11 - 0x30) < 10) {
      if (iVar16 < 0x11) {
        dVar7 = dVar7 * 10.0 + (double)(int)(bVar11 - 0x30);
        iVar19 = iVar19 + -1;
        if (0.0 < dVar7) {
          iVar16 = iVar16 + 1;
        }
      }
      pbVar12 = pbVar14 + 1;
      pbVar14 = pbVar14 + 1;
      bVar11 = *pbVar12;
    }
  }
  else {
    iVar19 = 0;
  }
  pbVar12 = pbVar14;
  if ((*pbVar14 | 0x20) == 0x65) {
    uVar17 = (ulong)uVar21;
    if (bVar10) {
      uVar17 = i;
    }
    if (!bVar8) {
      auVar23._8_4_ = (int)(uVar17 >> 0x20);
      auVar23._0_8_ = uVar17;
      auVar23._12_4_ = 0x45300000;
      dVar7 = (auVar23._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar17) - 4503599627370496.0);
      bVar8 = true;
    }
    if (pbVar14[1] == 0x2d) {
      pbVar12 = pbVar14 + 2;
      bVar9 = true;
    }
    else {
      if (pbVar14[1] == 0x2b) {
        pbVar12 = pbVar14 + 2;
      }
      else {
        pbVar12 = pbVar14 + 1;
      }
      bVar9 = false;
    }
    if ((byte)(*pbVar12 - 0x30) < 10) {
      pbVar14 = pbVar12 + 1;
      iVar20 = *pbVar12 - 0x30;
      if (bVar9) {
        bVar11 = *pbVar14;
        while ((byte)(bVar11 - 0x30) < 10) {
          iVar20 = (uint)bVar11 + iVar20 * 10 + -0x30;
          if (iVar20 < 0xccccccc) {
            pbVar14 = pbVar14 + 1;
          }
          else {
            do {
              pbVar12 = pbVar14 + 1;
              pbVar14 = pbVar14 + 1;
            } while ((byte)(*pbVar12 - 0x30) < 10);
          }
          bVar11 = *pbVar14;
        }
      }
      else {
        pbVar12 = pbVar12 + (1 - (long)pCVar4);
        do {
          bVar11 = *pbVar14;
          bVar18 = bVar11 - 0x3a;
          if (bVar18 < 0xf6) goto LAB_0011bcbb;
          pbVar14 = pbVar14 + 1;
          iVar20 = (uint)bVar11 + iVar20 * 10 + -0x30;
          pbVar12 = pbVar12 + 1;
        } while (iVar20 <= 0x134 - iVar19);
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                        ,0x3ae,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
        *(undefined4 *)(this + 0x30) = 0xd;
        *(byte **)(this + 0x38) = pbVar12;
LAB_0011bcbb:
        if (0xf5 < bVar18) {
          bVar9 = false;
          pbVar12 = pbVar14;
          goto LAB_0011bd9b;
        }
      }
      iVar16 = -iVar20;
      if (!bVar9) {
        iVar16 = iVar20;
      }
      iVar20 = iVar16;
      bVar9 = true;
      pbVar12 = pbVar14;
    }
    else {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                      ,0x3b3,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      *(undefined4 *)(this + 0x30) = 0xf;
      *(long *)(this + 0x38) = (long)pbVar12 - (long)pCVar4;
      bVar9 = false;
      iVar20 = 0;
    }
LAB_0011bd9b:
    if (!bVar9) goto LAB_0011beec;
  }
  if (!bVar8) {
    if (bVar10) {
      if (cVar2 == '-') {
        bVar10 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 ::Int64(handler,-i);
      }
      else {
        bVar10 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 ::Uint64(handler,i);
      }
    }
    else if (cVar2 == '-') {
      bVar10 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
               ::Int(handler,-uVar21);
    }
    else {
      bVar10 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
               ::Uint(handler,uVar21);
    }
    if (bVar10 == false) {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                      ,0x3d6,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      lVar13 = (long)pbVar12 - (long)pCVar4;
      *(undefined4 *)(this + 0x30) = 0x10;
LAB_0011be69:
      *(long *)(this + 0x38) = lVar13;
    }
    goto LAB_0011beec;
  }
  uVar21 = iVar20 + iVar19;
  if ((int)uVar21 < -0x134) {
    dVar22 = 0.0;
    if (-0x269 < (int)uVar21) {
      uVar21 = -uVar21 - 0x134;
      if (0x134 < uVar21) goto LAB_0011bf5f;
      dVar7 = dVar7 / 1e+308;
LAB_0011be82:
      dVar22 = dVar7 / *(double *)(internal::Pow10(int)::e + (ulong)uVar21 * 8);
    }
  }
  else {
    if ((int)uVar21 < 0) {
      uVar21 = -uVar21;
      if (0x134 < uVar21) goto LAB_0011bf5f;
      goto LAB_0011be82;
    }
    if (0x134 < uVar21) {
LAB_0011bf5f:
      __assert_fail("n >= 0 && n <= 308",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/internal/pow10.h"
                    ,0x30,"double rapidjson::internal::Pow10(int)");
    }
    dVar22 = dVar7 * *(double *)(internal::Pow10(int)::e + (ulong)uVar21 * 8);
  }
  if (cVar2 == '-') {
    dVar22 = -dVar22;
  }
  if ((handler->stack_).stackEnd_ <= (handler->stack_).stackTop_ + 0x18) {
    internal::Stack<rapidjson::CrtAllocator>::
    Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
              (&handler->stack_,1);
  }
  pdVar6 = (double *)(handler->stack_).stackTop_;
  (handler->stack_).stackTop_ = (char *)(pdVar6 + 3);
  *pdVar6 = 0.0;
  pdVar6[1] = 0.0;
  *(undefined4 *)(pdVar6 + 2) = 0x4206;
  *pdVar6 = dVar22;
LAB_0011beec:
  is->src_ = (Ch *)pbVar12;
  is->head_ = pCVar4;
  return;
}

Assistant:

Ch Peek() const { return *src_; }